

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_ecc_weierstrass_add_general(void)

{
  WeierstrassCurve *wc;
  WeierstrassPoint *dest;
  WeierstrassPoint *dest_00;
  size_t sVar1;
  size_t sVar2;
  WeierstrassPoint *pWVar3;
  WeierstrassPoint *src;
  size_t sVar4;
  
  wc = wcurve();
  dest = ecc_weierstrass_point_new_identity(wc);
  dest_00 = ecc_weierstrass_point_new_identity(wc);
  sVar1 = (*looplimit)(5);
  if (sVar1 != 0) {
    sVar1 = 0;
    do {
      sVar2 = (*looplimit)(5);
      if (sVar2 != 0) {
        sVar2 = 0;
        do {
          pWVar3 = wpoint(wc,sVar1);
          src = wpoint(wc,sVar2);
          ecc_weierstrass_point_copy_into(dest,pWVar3);
          ecc_weierstrass_point_copy_into(dest_00,src);
          ecc_weierstrass_point_free(pWVar3);
          ecc_weierstrass_point_free(src);
          test_index = test_index + 1;
          last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
          (*log_to_file)(last_filename);
          pWVar3 = ecc_weierstrass_add_general(dest,dest_00);
          (*log_to_file)((char *)0x0);
          safefree(last_filename);
          ecc_weierstrass_point_free(pWVar3);
          sVar2 = sVar2 + 1;
          sVar4 = (*looplimit)(5);
        } while (sVar2 < sVar4);
      }
      sVar1 = sVar1 + 1;
      sVar2 = (*looplimit)(5);
    } while (sVar1 < sVar2);
  }
  ecc_weierstrass_point_free(dest);
  ecc_weierstrass_point_free(dest_00);
  ecc_weierstrass_curve_free(wc);
  return;
}

Assistant:

static void test_ecc_weierstrass_add_general(void)
{
    WeierstrassCurve *wc = wcurve();
    WeierstrassPoint *a = ecc_weierstrass_point_new_identity(wc);
    WeierstrassPoint *b = ecc_weierstrass_point_new_identity(wc);
    for (size_t i = 0; i < looplimit(5); i++) {
        for (size_t j = 0; j < looplimit(5); j++) {
            WeierstrassPoint *A = wpoint(wc, i), *B = wpoint(wc, j);
            ecc_weierstrass_point_copy_into(a, A);
            ecc_weierstrass_point_copy_into(b, B);
            ecc_weierstrass_point_free(A);
            ecc_weierstrass_point_free(B);

            log_start();
            WeierstrassPoint *r = ecc_weierstrass_add_general(a, b);
            log_end();
            ecc_weierstrass_point_free(r);
        }
    }
    ecc_weierstrass_point_free(a);
    ecc_weierstrass_point_free(b);
    ecc_weierstrass_curve_free(wc);
}